

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_waiter.c
# Opt level: O1

void do_once(nsync_atomic_uint32_ *ponce,_func_void_void_ptr *dest)

{
  bool bVar1;
  
  if (pt_once != 2) {
    if (pt_once == 0) {
      do {
        LOCK();
        bVar1 = pt_once == 0;
        if (bVar1) {
          pt_once = 1;
        }
        UNLOCK();
        if (bVar1) {
          pthread_key_create(&waiter_key,(__destr_function *)ponce);
          pt_once = 2;
          break;
        }
      } while (pt_once == 0);
    }
    while (pt_once != 2) {
      sched_yield();
    }
  }
  return;
}

Assistant:

static void do_once (nsync_atomic_uint32_ *ponce, void (*dest) (void *)) {
	uint32_t o = ATM_LOAD_ACQ (ponce);
	if (o != 2) {
		while (o == 0 && !ATM_CAS_ACQ (ponce, 0, 1)) {
			o = ATM_LOAD (ponce);
		}
		if (o == 0) {
			pthread_key_create (&waiter_key, dest);
			ATM_STORE_REL (ponce, 2);
		}
		while (ATM_LOAD_ACQ (ponce) != 2) {
			sched_yield ();
		}
	}
}